

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O1

bool __thiscall
spvtools::val::Construct::IsStructuredExit(Construct *this,ValidationState_t *_,BasicBlock *dest)

{
  short sVar1;
  uint16_t uVar2;
  pointer ppVar3;
  BasicBlock *pBVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  BasicBlock *pBVar9;
  BasicBlock *pBVar10;
  byte unaff_BPL;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *use;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *use_1;
  pointer ppVar11;
  Instruction *pIVar12;
  BasicBlock *unaff_R15;
  BasicBlock *pBVar13;
  bool bVar14;
  bool bVar15;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar16;
  
  switch(this->type_) {
  case kSelection:
    if (this->exit_block_ == dest) {
      unaff_BPL = 1;
      goto LAB_006a9009;
    }
    pBVar4 = this->entry_block_;
    pBVar13 = (BasicBlock *)
              (pBVar4->label_->uses_).
              super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar9 = (BasicBlock *)
                  (pBVar4->label_->uses_).
                  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar15 = pBVar9 == pBVar13, !bVar15;
        pBVar9 = (BasicBlock *)&pBVar9->immediate_structural_dominator_) {
      sVar1 = *(short *)(*(long *)pBVar9 + 0x3a);
      if (((sVar1 == 0xf6) || (bVar14 = true, sVar1 == 0xf7)) &&
         (bVar14 = true, *(int *)&pBVar9->immediate_dominator_ == 1)) {
        bVar5 = BasicBlock::structurally_dominates(*(BasicBlock **)(*(long *)pBVar9 + 0x68),pBVar4);
        bVar14 = true;
        if (bVar5) {
          bVar14 = *(BasicBlock **)(*(long *)pBVar9 + 0x68) == pBVar4;
          if (!bVar14) {
            unaff_R15 = *(BasicBlock **)(*(long *)pBVar9 + 0x68);
          }
        }
      }
      if (!bVar14) break;
    }
    if (bVar15) {
      unaff_R15 = BasicBlock::immediate_structural_dominator(pBVar4);
    }
    if (unaff_R15 == (BasicBlock *)0x0) {
      bVar15 = true;
    }
    else {
      bVar15 = false;
      do {
        pIVar12 = unaff_R15->terminator_;
        uVar2 = pIVar12[-1].inst_.opcode;
        if ((uVar2 == 0xf6) ||
           (((pBVar13 = unaff_R15, uVar2 == 0xf7 && ((pBVar4->terminator_->inst_).opcode != 0xfb))
            && ((pIVar12->inst_).opcode == 0xfb)))) {
          pBVar9 = (BasicBlock *)(pIVar12 + -1);
          uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)pBVar9,0);
          pVar16 = val::Function::GetBlock(pIVar12[-1].function_,uVar7);
          bVar14 = BasicBlock::structurally_dominates(pVar16.first,pBVar4);
          if (bVar14) {
            ppVar3 = (unaff_R15->label_->uses_).
                     super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar11 = (unaff_R15->label_->uses_).
                           super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; bVar14 = ppVar11 == ppVar3,
                !bVar14; ppVar11 = ppVar11 + 1) {
              uVar2 = (ppVar11->first->inst_).opcode;
              if (((uVar2 == 0xf6) || (bVar5 = true, uVar2 == 0xf7)) &&
                 (bVar5 = true, ppVar11->second == 1)) {
                bVar6 = BasicBlock::structurally_dominates(ppVar11->first->block_,unaff_R15);
                bVar5 = true;
                if (bVar6) {
                  pBVar13 = ppVar11->first->block_;
                  bVar5 = pBVar13 == unaff_R15;
                  if (!bVar5) {
                    pBVar9 = pBVar13;
                  }
                }
              }
              if (!bVar5) break;
            }
            uVar7 = 2;
            if (bVar14) {
              pBVar9 = BasicBlock::immediate_structural_dominator(unaff_R15);
            }
            unaff_R15 = pBVar9;
            bVar14 = false;
          }
          else if (((bVar15) && (pIVar12[-1].inst_.opcode != 0xf6)) || (dest->id_ != uVar7)) {
            if (pIVar12[-1].inst_.opcode == 0xf6) {
              uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)pBVar9,1);
              unaff_BPL = unaff_BPL | dest->id_ == uVar7;
              if (dest->id_ == uVar7) goto LAB_006a8ea8;
            }
            uVar7 = 1;
            if ((pIVar12->inst_).opcode == 0xfb) {
              bVar15 = true;
            }
            bVar14 = false;
            if (pIVar12[-1].inst_.opcode == 0xf6) {
              unaff_BPL = 0;
            }
            else {
              bVar14 = true;
              uVar7 = 0;
            }
          }
          else {
            unaff_BPL = 1;
LAB_006a8ea8:
            bVar14 = false;
            uVar7 = 1;
          }
          pBVar9 = unaff_R15;
          pBVar10 = unaff_R15;
          pBVar13 = unaff_R15;
          if (bVar14) goto LAB_006a8eee;
        }
        else {
LAB_006a8eee:
          ppVar3 = (pBVar13->label_->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          unaff_R15 = pBVar9;
          for (ppVar11 = (pBVar13->label_->uses_).
                         super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; bVar14 = ppVar11 != ppVar3,
              bVar14; ppVar11 = ppVar11 + 1) {
            uVar2 = (ppVar11->first->inst_).opcode;
            if (((uVar2 == 0xf6) || (bVar5 = true, uVar2 == 0xf7)) &&
               (bVar5 = true, ppVar11->second == 1)) {
              bVar6 = BasicBlock::structurally_dominates(ppVar11->first->block_,pBVar13);
              bVar5 = true;
              if (bVar6) {
                pBVar9 = ppVar11->first->block_;
                bVar5 = pBVar9 == pBVar13;
                if (!bVar5) {
                  unaff_R15 = pBVar9;
                }
              }
            }
            if (!bVar5) break;
          }
          uVar7 = 0;
          pBVar10 = unaff_R15;
          if (!bVar14) {
            pBVar10 = BasicBlock::immediate_structural_dominator(pBVar13);
          }
        }
        if ((uVar7 & 1) != 0) goto LAB_006a8f8c;
        pBVar9 = unaff_R15;
        unaff_R15 = pBVar10;
      } while (pBVar10 != (BasicBlock *)0x0);
      uVar7 = 0;
LAB_006a8f8c:
      bVar15 = uVar7 == 0;
    }
    if (!bVar15) goto LAB_006a9009;
    break;
  case kContinue:
    pBVar4 = (*(this->corresponding_constructs_).
               super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->entry_block_;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(pBVar4->terminator_ + -1,0);
    unaff_BPL = 1;
    if ((pBVar4 == dest) || (dest->id_ == uVar7)) goto LAB_006a9009;
    break;
  case kLoop:
    pIVar12 = this->entry_block_->terminator_ + -1;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar12,0);
    uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar12,1);
    unaff_BPL = 1;
    if ((dest->id_ == uVar7) || (dest->id_ == uVar8)) goto LAB_006a9009;
    break;
  case kCase:
    __assert_fail("type() != ConstructType::kCase",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/construct.cpp"
                  ,0x86,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  default:
    __assert_fail("type() == ConstructType::kSelection",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/construct.cpp"
                  ,0x9c,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  }
  unaff_BPL = 0;
LAB_006a9009:
  return (bool)(unaff_BPL & 1);
}

Assistant:

ConstructType Construct::type() const { return type_; }